

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

bool testing::internal::String::CaseInsensitiveWideCStringEquals(wchar_t *lhs,wchar_t *rhs)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = lhs == (wchar_t *)0x0 && rhs == (wchar_t *)0x0;
  if (rhs != (wchar_t *)0x0 && lhs != (wchar_t *)0x0) {
    iVar1 = wcscasecmp(lhs,rhs);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool String::CaseInsensitiveWideCStringEquals(const wchar_t* lhs,
                                              const wchar_t* rhs) {
  if (lhs == NULL) return rhs == NULL;

  if (rhs == NULL) return false;

#if GTEST_OS_WINDOWS
  return _wcsicmp(lhs, rhs) == 0;
#elif GTEST_OS_LINUX && !GTEST_OS_LINUX_ANDROID
  return wcscasecmp(lhs, rhs) == 0;
#else
  // Android, Mac OS X and Cygwin don't define wcscasecmp.
  // Other unknown OSes may not define it either.
  wint_t left, right;
  do {
    left = towlower(*lhs++);
    right = towlower(*rhs++);
  } while (left && left == right);
  return left == right;
#endif  // OS selector
}